

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O3

ll_elem * succ(ll_head *q_head,ll_elem *n)

{
  ll_elem *plVar1;
  ulong uVar2;
  ll_elem *plVar3;
  ll_elem *plVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong *puVar8;
  bool bVar9;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x10e,
                  "struct ll_elem *succ(struct ll_head *, struct ll_elem *)");
  }
  puVar7 = (ulong *)((ulong)n & 0xfffffffffffffffc);
  if (puVar7 == (ulong *)0x0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x110,
                  "struct ll_elem *succ(struct ll_head *, struct ll_elem *)");
  }
  plVar4 = (ll_elem *)*puVar7;
  do {
    LOCK();
    plVar1 = (ll_elem *)*puVar7;
    bVar9 = plVar4 == plVar1;
    if (bVar9) {
      *puVar7 = (ulong)plVar4 | 1;
      plVar1 = plVar4;
    }
    UNLOCK();
    plVar4 = plVar1;
  } while (!bVar9);
  while (((ulong)plVar1 & 1) != 0) {
    plVar4 = (ll_elem *)*puVar7;
    do {
      LOCK();
      plVar1 = (ll_elem *)*puVar7;
      bVar9 = plVar4 == plVar1;
      if (bVar9) {
        *puVar7 = (ulong)plVar4 | 1;
        plVar1 = plVar4;
      }
      UNLOCK();
      plVar4 = plVar1;
    } while (!bVar9);
  }
  puVar8 = (ulong *)((ulong)plVar1 & 0xfffffffffffffffc);
  if (puVar8 == (ulong *)0x0) {
    LOCK();
    uVar5 = *puVar7;
    *puVar7 = *puVar7 & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar5 & 1) == 0) goto LAB_00101a37;
  }
  else {
    LOCK();
    puVar8[2] = puVar8[2] + 1;
    UNLOCK();
    LOCK();
    uVar5 = *puVar7;
    *puVar7 = *puVar7 & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar5 & 1) == 0) {
LAB_00101a37:
      __assert_fail("old & DEREF",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xb0
                    ,"struct ll_elem *deref(elem_ptr_t *)");
    }
    uVar5 = puVar8[1];
    while ((uVar5 & 2) != 0) {
      uVar5 = *puVar8;
      do {
        LOCK();
        uVar2 = *puVar8;
        bVar9 = uVar5 == uVar2;
        if (bVar9) {
          *puVar8 = uVar5 | 1;
          uVar2 = uVar5;
        }
        UNLOCK();
        uVar5 = uVar2;
      } while (!bVar9);
      while ((uVar2 & 1) != 0) {
        uVar5 = *puVar8;
        do {
          LOCK();
          uVar2 = *puVar8;
          bVar9 = uVar5 == uVar2;
          if (bVar9) {
            *puVar8 = uVar5 | 1;
            uVar2 = uVar5;
          }
          UNLOCK();
          uVar5 = uVar2;
        } while (!bVar9);
      }
      puVar6 = (ulong *)(uVar2 & 0xfffffffffffffffc);
      if (puVar6 != (ulong *)0x0) {
        LOCK();
        puVar6[2] = puVar6[2] + 1;
        UNLOCK();
      }
      LOCK();
      uVar5 = *puVar8;
      *puVar8 = *puVar8 & 0xfffffffffffffffe;
      UNLOCK();
      if ((uVar5 & 1) == 0) goto LAB_00101a37;
      if (((ulong)plVar1 & 1) != 0) {
        __assert_fail("!((uintptr_t)old & DEREF)",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0xdb,"int ptr_cas(elem_ptr_t *, struct ll_elem **, struct ll_elem *)");
      }
      plVar4 = (ll_elem *)((ulong)((uint)plVar1 & 2) | (ulong)puVar6);
      do {
        LOCK();
        plVar3 = (ll_elem *)*puVar7;
        bVar9 = plVar1 == plVar3;
        if (bVar9) {
          *puVar7 = (ulong)plVar4 | 1;
          plVar3 = plVar1;
        }
        UNLOCK();
        if (bVar9) {
          LOCK();
          puVar6[2] = puVar6[2] + 1;
          UNLOCK();
          LOCK();
          uVar5 = *puVar7;
          *puVar7 = *puVar7 & 0xfffffffffffffffe;
          UNLOCK();
          if ((uVar5 & 1) == 0) {
            __assert_fail("p & DEREF",
                          "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                          ,0xf5,"void ptr_clear_deref(elem_ptr_t *)");
          }
          LOCK();
          puVar8 = puVar8 + 2;
          uVar5 = *puVar8;
          *puVar8 = *puVar8 - 2;
          UNLOCK();
          if (1 < uVar5) goto LAB_00101a16;
          goto LAB_00101a56;
        }
      } while ((ll_elem *)((ulong)plVar3 & 0xfffffffffffffffe) == plVar1);
      LOCK();
      puVar8 = puVar8 + 2;
      uVar5 = *puVar8;
      *puVar8 = *puVar8 - 1;
      UNLOCK();
      if (uVar5 == 0) {
LAB_00101a56:
        __assert_fail("old >= count",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x9a,"void deref_release(struct ll_head *, struct ll_elem *, size_t)");
      }
      LOCK();
      puVar6 = puVar6 + 2;
      uVar5 = *puVar6;
      *puVar6 = *puVar6 - 1;
      UNLOCK();
      if (uVar5 == 0) goto LAB_00101a56;
      plVar1 = (ll_elem *)*puVar7;
      do {
        LOCK();
        plVar4 = (ll_elem *)*puVar7;
        bVar9 = plVar1 == plVar4;
        if (bVar9) {
          *puVar7 = (ulong)plVar1 | 1;
          plVar4 = plVar1;
        }
        UNLOCK();
        plVar1 = plVar4;
      } while (!bVar9);
      while (((ulong)plVar4 & 1) != 0) {
        plVar1 = (ll_elem *)*puVar7;
        do {
          LOCK();
          plVar4 = (ll_elem *)*puVar7;
          bVar9 = plVar1 == plVar4;
          if (bVar9) {
            *puVar7 = (ulong)plVar1 | 1;
            plVar4 = plVar1;
          }
          UNLOCK();
          plVar1 = plVar4;
        } while (!bVar9);
      }
      puVar6 = (ulong *)((ulong)plVar4 & 0xfffffffffffffffc);
      if (puVar6 != (ulong *)0x0) {
        LOCK();
        puVar6[2] = puVar6[2] + 1;
        UNLOCK();
      }
      LOCK();
      uVar5 = *puVar7;
      *puVar7 = *puVar7 & 0xfffffffffffffffe;
      UNLOCK();
      if ((uVar5 & 1) == 0) goto LAB_00101a37;
LAB_00101a16:
      puVar8 = puVar6;
      plVar1 = plVar4;
      uVar5 = puVar6[1];
    }
  }
  return plVar1;
}

Assistant:

static struct ll_elem*
succ(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *s, *s_, *ss;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	s = deref(&n->succ);
	/* If s is null, n is not on the queue. */
	if (ptr_clear(s) == NULL)
		return s;

	while (deleted(s)) {
		ss = flag_combine(deref(&ptr_clear(s)->succ), s);
		s_ = s;
		if (ptr_cas(&n->succ, &s_, ss)) {
			/* cas succeeded */
			deref_acquire(ss, 1);
			ptr_clear_deref(&n->succ);

			/* Release s:
			 * - once for n->succ
			 * - once because we no longer claim s.
			 */
			deref_release(q_head, s, 2);
			s = ss;
		} else {
			/* cas failed */
			deref_release(q_head, s, 1);
			deref_release(q_head, ss, 1);

			/*
			 * Cannot do s = s_, since we do not have the lock on
			 * n->succ at the moment and thus cannot acquire the
			 * reference counter on s_.
			 */
			s = deref(&n->succ);
		}
	}

	return s;
}